

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRConsoleNode.cpp
# Opt level: O2

void __thiscall MinVR::VRConsoleNode::println(VRConsoleNode *this,string *output)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->m_stream,(string *)output);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void VRConsoleNode::println(const std::string &output) {
	*m_stream << output << std::endl;
}